

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ExecutionModel stage_to_execution_model(string *stage)

{
  bool bVar1;
  CompilerError *this;
  string *stage_local;
  
  bVar1 = std::operator==(stage,"vert");
  if (bVar1) {
    stage_local._4_4_ = ExecutionModelVertex;
  }
  else {
    bVar1 = std::operator==(stage,"frag");
    if (bVar1) {
      stage_local._4_4_ = ExecutionModelFragment;
    }
    else {
      bVar1 = std::operator==(stage,"comp");
      if (bVar1) {
        stage_local._4_4_ = ExecutionModelGLCompute;
      }
      else {
        bVar1 = std::operator==(stage,"tesc");
        if (bVar1) {
          stage_local._4_4_ = ExecutionModelTessellationControl;
        }
        else {
          bVar1 = std::operator==(stage,"tese");
          if (bVar1) {
            stage_local._4_4_ = ExecutionModelTessellationEvaluation;
          }
          else {
            bVar1 = std::operator==(stage,"geom");
            if (bVar1) {
              stage_local._4_4_ = ExecutionModelGeometry;
            }
            else {
              bVar1 = std::operator==(stage,"rgen");
              if (bVar1) {
                stage_local._4_4_ = ExecutionModelRayGenerationKHR;
              }
              else {
                bVar1 = std::operator==(stage,"rint");
                if (bVar1) {
                  stage_local._4_4_ = ExecutionModelIntersectionKHR;
                }
                else {
                  bVar1 = std::operator==(stage,"rahit");
                  if (bVar1) {
                    stage_local._4_4_ = ExecutionModelAnyHitKHR;
                  }
                  else {
                    bVar1 = std::operator==(stage,"rchit");
                    if (bVar1) {
                      stage_local._4_4_ = ExecutionModelClosestHitKHR;
                    }
                    else {
                      bVar1 = std::operator==(stage,"rmiss");
                      if (bVar1) {
                        stage_local._4_4_ = ExecutionModelMissKHR;
                      }
                      else {
                        bVar1 = std::operator==(stage,"rcall");
                        if (bVar1) {
                          stage_local._4_4_ = ExecutionModelCallableKHR;
                        }
                        else {
                          bVar1 = std::operator==(stage,"mesh");
                          if (bVar1) {
                            stage_local._4_4_ = ExecutionModelMeshEXT;
                          }
                          else {
                            bVar1 = std::operator==(stage,"task");
                            if (!bVar1) {
                              this = (CompilerError *)__cxa_allocate_exception(0x10);
                              spirv_cross::CompilerError::CompilerError(this,"Invalid stage.");
                              __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,
                                          spirv_cross::CompilerError::~CompilerError);
                            }
                            stage_local._4_4_ = ExecutionModelTaskEXT;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return stage_local._4_4_;
}

Assistant:

static ExecutionModel stage_to_execution_model(const std::string &stage)
{
	if (stage == "vert")
		return ExecutionModelVertex;
	else if (stage == "frag")
		return ExecutionModelFragment;
	else if (stage == "comp")
		return ExecutionModelGLCompute;
	else if (stage == "tesc")
		return ExecutionModelTessellationControl;
	else if (stage == "tese")
		return ExecutionModelTessellationEvaluation;
	else if (stage == "geom")
		return ExecutionModelGeometry;
	else if (stage == "rgen")
		return ExecutionModelRayGenerationKHR;
	else if (stage == "rint")
		return ExecutionModelIntersectionKHR;
	else if (stage == "rahit")
		return ExecutionModelAnyHitKHR;
	else if (stage == "rchit")
		return ExecutionModelClosestHitKHR;
	else if (stage == "rmiss")
		return ExecutionModelMissKHR;
	else if (stage == "rcall")
		return ExecutionModelCallableKHR;
	else if (stage == "mesh")
		return spv::ExecutionModelMeshEXT;
	else if (stage == "task")
		return spv::ExecutionModelTaskEXT;
	else
		SPIRV_CROSS_THROW("Invalid stage.");
}